

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathCompExprAdd(xmlXPathParserContextPtr ctxt,int ch1,int ch2,xmlXPathOp op,int value,
                       int value2,int value3,void *value4,void *value5)

{
  xmlXPathCompExprPtr pxVar1;
  int iVar2;
  xmlXPathStepOp *pxVar3;
  xmlChar *pxVar4;
  int newSize;
  xmlXPathStepOp *real;
  xmlXPathCompExprPtr comp;
  int value2_local;
  int value_local;
  xmlXPathOp op_local;
  int ch2_local;
  int ch1_local;
  xmlXPathParserContextPtr ctxt_local;
  
  pxVar1 = ctxt->comp;
  if (pxVar1->maxStep <= pxVar1->nbStep) {
    iVar2 = xmlGrowCapacity(pxVar1->maxStep,0x38,10,1000000);
    if (iVar2 < 0) {
      xmlXPathPErrMemory(ctxt);
      return -1;
    }
    pxVar3 = (xmlXPathStepOp *)(*xmlRealloc)(pxVar1->steps,(long)iVar2 * 0x38);
    if (pxVar3 == (xmlXPathStepOp *)0x0) {
      xmlXPathPErrMemory(ctxt);
      return -1;
    }
    pxVar1->steps = pxVar3;
    pxVar1->maxStep = iVar2;
  }
  pxVar1->last = pxVar1->nbStep;
  pxVar1->steps[pxVar1->nbStep].ch1 = ch1;
  pxVar1->steps[pxVar1->nbStep].ch2 = ch2;
  pxVar1->steps[pxVar1->nbStep].op = op;
  pxVar1->steps[pxVar1->nbStep].value = value;
  pxVar1->steps[pxVar1->nbStep].value2 = value2;
  pxVar1->steps[pxVar1->nbStep].value3 = value3;
  if ((pxVar1->dict == (xmlDictPtr)0x0) ||
     (((op != XPATH_OP_FUNCTION && (op != XPATH_OP_VARIABLE)) && (op != XPATH_OP_COLLECT)))) {
    pxVar1->steps[pxVar1->nbStep].value4 = value4;
    pxVar1->steps[pxVar1->nbStep].value5 = value5;
  }
  else {
    if (value4 == (void *)0x0) {
      pxVar1->steps[pxVar1->nbStep].value4 = (void *)0x0;
    }
    else {
      pxVar4 = xmlDictLookup(pxVar1->dict,(xmlChar *)value4,-1);
      pxVar1->steps[pxVar1->nbStep].value4 = pxVar4;
      (*xmlFree)(value4);
    }
    if (value5 == (void *)0x0) {
      pxVar1->steps[pxVar1->nbStep].value5 = (void *)0x0;
    }
    else {
      pxVar4 = xmlDictLookup(pxVar1->dict,(xmlChar *)value5,-1);
      pxVar1->steps[pxVar1->nbStep].value5 = pxVar4;
      (*xmlFree)(value5);
    }
  }
  pxVar1->steps[pxVar1->nbStep].cache = (xmlXPathFunction)0x0;
  iVar2 = pxVar1->nbStep;
  pxVar1->nbStep = iVar2 + 1;
  return iVar2;
}

Assistant:

static int
xmlXPathCompExprAdd(xmlXPathParserContextPtr ctxt, int ch1, int ch2,
   xmlXPathOp op, int value,
   int value2, int value3, void *value4, void *value5) {
    xmlXPathCompExprPtr comp = ctxt->comp;
    if (comp->nbStep >= comp->maxStep) {
	xmlXPathStepOp *real;
        int newSize;

        newSize = xmlGrowCapacity(comp->maxStep, sizeof(real[0]),
                                  10, XPATH_MAX_STEPS);
        if (newSize < 0) {
	    xmlXPathPErrMemory(ctxt);
	    return(-1);
        }
	real = xmlRealloc(comp->steps, newSize * sizeof(real[0]));
	if (real == NULL) {
	    xmlXPathPErrMemory(ctxt);
	    return(-1);
	}
	comp->steps = real;
	comp->maxStep = newSize;
    }
    comp->last = comp->nbStep;
    comp->steps[comp->nbStep].ch1 = ch1;
    comp->steps[comp->nbStep].ch2 = ch2;
    comp->steps[comp->nbStep].op = op;
    comp->steps[comp->nbStep].value = value;
    comp->steps[comp->nbStep].value2 = value2;
    comp->steps[comp->nbStep].value3 = value3;
    if ((comp->dict != NULL) &&
        ((op == XPATH_OP_FUNCTION) || (op == XPATH_OP_VARIABLE) ||
	 (op == XPATH_OP_COLLECT))) {
        if (value4 != NULL) {
	    comp->steps[comp->nbStep].value4 = (xmlChar *)
	        (void *)xmlDictLookup(comp->dict, value4, -1);
	    xmlFree(value4);
	} else
	    comp->steps[comp->nbStep].value4 = NULL;
        if (value5 != NULL) {
	    comp->steps[comp->nbStep].value5 = (xmlChar *)
	        (void *)xmlDictLookup(comp->dict, value5, -1);
	    xmlFree(value5);
	} else
	    comp->steps[comp->nbStep].value5 = NULL;
    } else {
	comp->steps[comp->nbStep].value4 = value4;
	comp->steps[comp->nbStep].value5 = value5;
    }
    comp->steps[comp->nbStep].cache = NULL;
    return(comp->nbStep++);
}